

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta)

{
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  bool bVar8;
  undefined8 extraout_RAX;
  long lVar9;
  _Head_base<0UL,_int_*,_false> _Var10;
  type it;
  int *piVar11;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var12;
  rc_data *ret;
  rc_data *__first;
  int iVar13;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var14;
  long lVar15;
  tuple<int_*,_std::default_delete<int[]>_> tVar16;
  ulong uVar17;
  rc_data *__last;
  long lVar18;
  long lVar19;
  bool bVar20;
  longdouble in_ST0;
  longdouble lVar21;
  longdouble in_ST1;
  longdouble lVar22;
  longdouble lVar23;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar24;
  undefined1 local_a8 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_98;
  long local_90;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_88;
  int local_7c;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_78;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
  *local_70;
  pair<int,_int> *local_68;
  pair<int,_int> *local_60;
  long local_58;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  longdouble local_3c;
  
  local_3c = theta;
  if (first._M_current != last._M_current) {
    local_70 = this + 8;
    lVar22 = kappa / ((longdouble)1 - kappa);
    lVar23 = in_ST5;
    local_68 = last._M_current;
    do {
      if (*(int *)(this + 0x80) <= (first._M_current)->first) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
LAB_001c50b8:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_78._M_head_impl = (col_value *)(long)(first._M_current)->first;
      local_60 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a8,(int)local_70);
      if (local_a8._8_8_ != local_a8._0_8_) {
        lVar19 = *(long *)(this + 0x68);
        _Var10._M_head_impl = (int *)local_a8._8_8_;
        do {
          *(longdouble *)(lVar19 + (long)*_Var10._M_head_impl * 0x10) =
               *(longdouble *)(lVar19 + (long)*_Var10._M_head_impl * 0x10) * local_3c;
          _Var10._M_head_impl = _Var10._M_head_impl + 8;
          lVar23 = in_ST5;
        } while (_Var10._M_head_impl != (int *)local_a8._0_8_);
      }
      if (local_a8._8_8_ == local_a8._0_8_) {
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        piVar11 = (int *)local_a8._8_8_;
        lVar21 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        lVar7 = in_ST5;
        in_ST5 = lVar23;
        do {
          in_ST4 = lVar7;
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,(int)local_70);
          lVar23 = (longdouble)0;
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_48._M_head_impl !=
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            lVar23 = (longdouble)0;
            do {
              local_7c = *(int *)(*(long *)(this + 0x48) + (long)*local_48._M_head_impl * 4);
              lVar23 = *(longdouble *)(*(long *)(this + 0x68) + (long)*local_48._M_head_impl * 0x10)
                       * (longdouble)local_7c + lVar23;
              local_48._M_head_impl = local_48._M_head_impl + 2;
              in_ST5 = in_ST4;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_48._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
          }
          lVar19 = *(long *)(this + 0x50);
          lVar18 = uVar17 * 0x20;
          *(int *)(lVar19 + 0x10 + lVar18) = (int)uVar17;
          _Var12._M_head_impl._0_4_ = *(uint *)(*(long *)(this + 0x48) + (long)*piVar11 * 4);
          *(uint *)(lVar19 + 0x14 + lVar18) = (uint)_Var12._M_head_impl;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x70),
                     (quadratic_cost_type<long_double> *)(ulong)*(uint *)(local_a8._8_8_ + 4),(int)x
                     ,(bit_array *)(ulong)(uint)_Var12._M_head_impl);
          *(longdouble *)(*(long *)(this + 0x50) + lVar18) = lVar21 - lVar23;
          piVar11 = piVar11 + 2;
          uVar17 = uVar17 + 1;
          lVar21 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
          lVar7 = in_ST5;
          lVar23 = in_ST5;
        } while (piVar11 != (int *)local_a8._0_8_);
      }
      tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)(uVar17 & 0xffffffff);
      if (1 < (uint)uVar17) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar16.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl,
                   (int)LZCOUNT(tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar16.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl);
        __last = __first + 1;
        lVar19 = (long)tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl * 0x20 + -0x20;
        do {
          lVar23 = in_ST5;
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar19 = lVar19 + -0x20;
        } while (lVar19 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      local_90 = (long)local_78._M_head_impl * 3;
      local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)
           tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) + (long)local_78._M_head_impl * 0xc) < 1) {
        iVar13 = 0;
        _Var12._M_head_impl = (row_value *)0xffffffff;
      }
      else {
        local_58 = (long)(int)(uint)uVar17 + -2;
        lVar19 = 0;
        iVar13 = 0;
        _Var14._M_head_impl =
             (row_value *)
             (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )0xffffffffffffffff;
        do {
          uVar2 = local_a8._8_8_;
          local_88._M_head_impl = _Var14._M_head_impl + 1;
          iVar13 = iVar13 + *(int *)(*(long *)(this + 0x50) + 0x14 + lVar19);
          iVar1 = *(int *)(*(long *)(this + 0x58) + local_90 * 4);
          lVar18 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar19);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_a8._8_8_ + (lVar18 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar18 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar18 * 2 * 4) * 0x10) +
               delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + lVar19) * (longdouble)0.5;
          _Var12._M_head_impl = local_88._M_head_impl;
          lVar23 = in_ST5;
          if (iVar1 <= iVar13) break;
          lVar19 = lVar19 + 0x20;
          bVar8 = (long)_Var14._M_head_impl < local_58;
          _Var14._M_head_impl = local_88._M_head_impl;
        } while (bVar8);
      }
      if (iVar13 < *(int *)(*(long *)(this + 0x58) + local_90 * 4)) {
        bVar8 = false;
      }
      else {
        bVar8 = iVar13 <= *(int *)(*(long *)(this + 0x58) + local_90 * 4 + 4);
      }
      if (((int)((uint)_Var12._M_head_impl + 1) <
           (int)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl) && (bVar8)) {
        local_88._M_head_impl =
             (row_value *)
             (long)(int)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar19 = (long)(int)(uint)_Var12._M_head_impl << 5;
        lVar18 = (long)(int)(uint)_Var12._M_head_impl + 2;
        do {
          uVar2 = local_a8._8_8_;
          lVar9 = *(long *)(this + 0x50);
          iVar13 = iVar13 + *(int *)(lVar9 + 0x34 + lVar19);
          if (iVar13 < *(int *)(*(long *)(this + 0x58) + local_90 * 4)) {
            bVar8 = false;
          }
          else {
            bVar8 = iVar13 <= *(int *)(*(long *)(this + 0x58) + local_90 * 4 + 4);
          }
          lVar15 = (long)*(int *)(lVar9 + 0x30 + lVar19);
          if (bVar8) {
            lVar23 = *(longdouble *)(lVar9 + 0x20 + lVar19);
            lVar21 = (longdouble)0;
            bVar8 = lVar23 == lVar21;
            bVar20 = lVar23 < lVar21;
            if ((bVar8) && (!NAN(lVar23) && !NAN(lVar21))) {
              dVar24 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar8 = dVar24 == 0.5;
              bVar20 = 0.5 < dVar24;
            }
            bVar8 = !bVar20 && !bVar8;
          }
          if (bVar8) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar15 * 2 + 1) * 4));
            lVar9 = *(long *)(this + 0x68);
            lVar15 = (long)*(int *)(uVar2 + lVar15 * 2 * 4) * 0x10;
            lVar23 = *(longdouble *)(lVar9 + lVar15) +
                     delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar19) *
                                      (longdouble)0.5;
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar15 * 2 + 1) * 4));
            lVar9 = *(long *)(this + 0x68);
            lVar15 = (long)*(int *)(uVar2 + lVar15 * 2 * 4) * 0x10;
            lVar23 = *(longdouble *)(lVar9 + lVar15) -
                     (delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar19) *
                                       (longdouble)0.5);
          }
          *(longdouble *)(lVar9 + lVar15) = lVar23;
          bVar20 = lVar18 < (long)local_88._M_head_impl;
          _Var12._M_head_impl._0_4_ = (int)_Var12._M_head_impl + 1;
          _Var12._M_head_impl._4_4_ = 0;
          lVar19 = lVar19 + 0x20;
          lVar18 = lVar18 + 1;
          lVar23 = in_ST5;
        } while ((bool)(bVar20 & bVar8));
      }
      if ((int)((uint)_Var12._M_head_impl + 1) <
          (int)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar19 = (long)(int)(uint)_Var12._M_head_impl << 5;
        iVar13 = ~(uint)_Var12._M_head_impl +
                 (int)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl;
        do {
          uVar2 = local_a8._8_8_;
          lVar18 = (long)*(int *)(*(long *)(this + 0x50) + 0x30 + lVar19);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_a8._8_8_ + (lVar18 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar18 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar18 * 2 * 4) * 0x10) -
               (delta + *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar19) * (longdouble)0.5 *
                        lVar22);
          lVar19 = lVar19 + 0x20;
          iVar13 = iVar13 + -1;
          in_ST5 = in_ST4;
          lVar23 = in_ST4;
        } while (iVar13 != 0);
      }
      bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                          *)this,(int)local_78._M_head_impl,x);
      if (!bVar8) goto LAB_001c50b8;
      first._M_current = local_60 + 1;
    } while (first._M_current != local_68);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }